

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O0

void DoubleToRational(double value,uint32_t *num,uint32_t *denom)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong local_50;
  uint64_t ullDenom2;
  uint64_t ullNum2;
  uint64_t ullDenom;
  uint64_t ullNum;
  double dblDiff2;
  double dblDiff;
  uint32_t *denom_local;
  uint32_t *num_local;
  double value_local;
  
  dblDiff = (double)denom;
  denom_local = num;
  num_local = (uint32_t *)value;
  if (0.0 <= value) {
    if (value <= 4294967295.0) {
      if ((value != (double)((long)value & 0xffffffff)) ||
         (NAN(value) || NAN((double)((long)value & 0xffffffff)))) {
        if (2.3283064370807974e-10 <= value) {
          ToRationalEuclideanGCD(value,0,0,&ullDenom,&ullNum2);
          ToRationalEuclideanGCD((double)num_local,0,1,&ullDenom2,&local_50);
          if ((((0xffffffff < ullDenom) || (0xffffffff < ullNum2)) || (0xffffffff < ullDenom2)) ||
             (0xffffffff < local_50)) {
            TIFFErrorExt((thandle_t)0x0,"TIFFLib: DoubleToRational()",
                         " Num or Denom exceeds ULONG: val=%14.6f, num=%12lu, denom=%12lu | num2=%12lu, denom2=%12lu"
                         ,num_local,ullDenom,ullNum2,ullDenom2,local_50);
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirwrite.c"
                          ,0xa9e,"void DoubleToRational(double, uint32_t *, uint32_t *)");
          }
          auVar1._8_4_ = (int)(ullDenom >> 0x20);
          auVar1._0_8_ = ullDenom;
          auVar1._12_4_ = 0x45300000;
          auVar3._8_4_ = (int)(ullNum2 >> 0x20);
          auVar3._0_8_ = ullNum2;
          auVar3._12_4_ = 0x45300000;
          auVar2._8_4_ = (int)(ullDenom2 >> 0x20);
          auVar2._0_8_ = ullDenom2;
          auVar2._12_4_ = 0x45300000;
          auVar4._8_4_ = (int)(local_50 >> 0x20);
          auVar4._0_8_ = local_50;
          auVar4._12_4_ = 0x45300000;
          if (ABS((double)num_local -
                  ((auVar2._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(uint32_t)ullDenom2) - 4503599627370496.0)) /
                  ((auVar4._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_50) - 4503599627370496.0))) <=
              ABS((double)num_local -
                  ((auVar1._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(uint32_t)ullDenom) - 4503599627370496.0)) /
                  ((auVar3._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)ullNum2) - 4503599627370496.0)))) {
            *denom_local = (uint32_t)ullDenom2;
            *(int *)dblDiff = (int)local_50;
          }
          else {
            *denom_local = (uint32_t)ullDenom;
            *(int *)dblDiff = (int)ullNum2;
          }
        }
        else {
          *num = 0;
          *denom = 0xffffffff;
        }
      }
      else {
        *num = (uint32_t)(long)value;
        *denom = 1;
      }
    }
    else {
      *num = 0xffffffff;
      *denom = 0;
    }
  }
  else {
    *denom = 0;
    *num = 0;
    TIFFErrorExt((thandle_t)0x0,"TIFFLib: DoubleToRational()",
                 " Negative Value for Unsigned Rational given.");
  }
  return;
}

Assistant:

static void DoubleToRational(double value, uint32_t *num, uint32_t *denom)
{
    /*---- UN-SIGNED RATIONAL ---- */
    double dblDiff, dblDiff2;
    uint64_t ullNum, ullDenom, ullNum2, ullDenom2;

    /*-- Check for negative values. If so it is an error. */
    /* Test written that way to catch NaN */
    if (!(value >= 0))
    {
        *num = *denom = 0;
        TIFFErrorExt(0, "TIFFLib: DoubleToRational()",
                     " Negative Value for Unsigned Rational given.");
        return;
    }

    /*-- Check for too big numbers (> ULONG_MAX) -- */
    if (value > 0xFFFFFFFFUL)
    {
        *num = 0xFFFFFFFFU;
        *denom = 0;
        return;
    }
    /*-- Check for easy integer numbers -- */
    if (value == (uint32_t)(value))
    {
        *num = (uint32_t)value;
        *denom = 1;
        return;
    }
    /*-- Check for too small numbers for "unsigned long" type rationals -- */
    if (value < 1.0 / (double)0xFFFFFFFFUL)
    {
        *num = 0;
        *denom = 0xFFFFFFFFU;
        return;
    }

    /*-- There are two approaches using the Euclidean algorithm,
     *   which can accidentally lead to different accuracies just depending on
     * the value. Try both and define which one was better.
     */
    ToRationalEuclideanGCD(value, FALSE, FALSE, &ullNum, &ullDenom);
    ToRationalEuclideanGCD(value, FALSE, TRUE, &ullNum2, &ullDenom2);
    /*-- Double-Check, that returned values fit into ULONG :*/
    if (ullNum > 0xFFFFFFFFUL || ullDenom > 0xFFFFFFFFUL ||
        ullNum2 > 0xFFFFFFFFUL || ullDenom2 > 0xFFFFFFFFUL)
    {
        TIFFErrorExt(0, "TIFFLib: DoubleToRational()",
                     " Num or Denom exceeds ULONG: val=%14.6f, num=%12" PRIu64
                     ", denom=%12" PRIu64 " | num2=%12" PRIu64
                     ", denom2=%12" PRIu64 "",
                     value, ullNum, ullDenom, ullNum2, ullDenom2);
        assert(0);
    }

    /* Check, which one has higher accuracy and take that. */
    dblDiff = fabs(value - ((double)ullNum / (double)ullDenom));
    dblDiff2 = fabs(value - ((double)ullNum2 / (double)ullDenom2));
    if (dblDiff < dblDiff2)
    {
        *num = (uint32_t)ullNum;
        *denom = (uint32_t)ullDenom;
    }
    else
    {
        *num = (uint32_t)ullNum2;
        *denom = (uint32_t)ullDenom2;
    }
}